

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int nextc(RN *rn)

{
  int iVar1;
  long lVar2;
  
  iVar1 = rn->n;
  lVar2 = (long)iVar1;
  if (lVar2 < 200) {
    rn->n = iVar1 + 1;
    rn->buff[lVar2] = (char)rn->c;
    iVar1 = getc((FILE *)rn->f);
    rn->c = iVar1;
  }
  else {
    rn->buff[0] = '\0';
  }
  return (uint)(lVar2 < 200);
}

Assistant:

static int nextc(RN *rn) {
    if (rn->n >= L_MAXLENNUM) {  /* buffer overflow? */
        rn->buff[0] = '\0';  /* invalidate result */
        return 0;  /* fail */
    } else {
        rn->buff[rn->n++] = rn->c;  /* save current char */
        rn->c = l_getc(rn->f);  /* read next one */
        return 1;
    }
}